

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiter.cpp
# Opt level: O0

void __thiscall
solitaire::time::ChronoFPSLimiter::ChronoFPSLimiter
          (ChronoFPSLimiter *this,uint fps,
          unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
          *stdTimeFunctionsWrapper)

{
  int iVar1;
  pointer pSVar2;
  undefined4 extraout_var;
  unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  *stdTimeFunctionsWrapper_local;
  uint fps_local;
  ChronoFPSLimiter *this_local;
  
  time::interfaces::FPSLimiter::FPSLimiter(&this->super_FPSLimiter);
  (this->super_FPSLimiter)._vptr_FPSLimiter = (_func_int **)&PTR__ChronoFPSLimiter_0050c8d8;
  this->frameTime = 1000.0 / (double)fps;
  std::
  unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  ::unique_ptr(&this->stdTimeFunctionsWrapper,stdTimeFunctionsWrapper);
  pSVar2 = std::
           unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
           ::operator->(&this->stdTimeFunctionsWrapper);
  iVar1 = (*pSVar2->_vptr_StdTimeFunctionsWrapper[2])();
  (this->frameStartTime).__d.__r = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

ChronoFPSLimiter::ChronoFPSLimiter(
    const unsigned fps,
    std::unique_ptr<StdTimeFunctionsWrapper> stdTimeFunctionsWrapper):
        frameTime {1000.0 / fps},
        stdTimeFunctionsWrapper {std::move(stdTimeFunctionsWrapper)},
        frameStartTime {this->stdTimeFunctionsWrapper->now()} {
}